

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_time.cc
# Opt level: O0

int ASN1_TIME_set_string_X509(ASN1_TIME *s,char *str)

{
  int iVar1;
  size_t len;
  uint8_t *_data;
  size_t len_s;
  undefined1 local_70 [8];
  tm tm;
  undefined1 local_30 [4];
  int type;
  CBS cbs;
  char *str_local;
  ASN1_TIME *s_local;
  
  cbs.len = (size_t)str;
  len = strlen(str);
  CBS_init((CBS *)local_30,(uint8_t *)str,len);
  iVar1 = CBS_parse_utc_time((CBS *)local_30,(tm *)0x0,0);
  if (iVar1 == 0) {
    iVar1 = CBS_parse_generalized_time((CBS *)local_30,(tm *)local_70,0);
    if (iVar1 == 0) {
      return 0;
    }
    tm.tm_zone._4_4_ = 0x18;
    iVar1 = fits_in_utc_time((tm *)local_70);
    if (iVar1 != 0) {
      tm.tm_zone._4_4_ = 0x17;
      CBS_skip((CBS *)local_30,2);
    }
  }
  else {
    tm.tm_zone._4_4_ = 0x17;
  }
  if (s != (ASN1_TIME *)0x0) {
    _data = CBS_data((CBS *)local_30);
    len_s = CBS_len((CBS *)local_30);
    iVar1 = ASN1_STRING_set(s,_data,len_s);
    if (iVar1 == 0) {
      return 0;
    }
    s->type = tm.tm_zone._4_4_;
  }
  return 1;
}

Assistant:

int ASN1_TIME_set_string_X509(ASN1_TIME *s, const char *str) {
  CBS cbs;
  CBS_init(&cbs, (const uint8_t *)str, strlen(str));
  int type;
  struct tm tm;
  if (CBS_parse_utc_time(&cbs, /*out_tm=*/NULL,
                         /*allow_timezone_offset=*/0)) {
    type = V_ASN1_UTCTIME;
  } else if (CBS_parse_generalized_time(&cbs, &tm,
                                        /*allow_timezone_offset=*/0)) {
    type = V_ASN1_GENERALIZEDTIME;
    if (fits_in_utc_time(&tm)) {
      type = V_ASN1_UTCTIME;
      CBS_skip(&cbs, 2);
    }
  } else {
    return 0;
  }

  if (s != NULL) {
    if (!ASN1_STRING_set(s, CBS_data(&cbs), CBS_len(&cbs))) {
      return 0;
    }
    s->type = type;
  }
  return 1;
}